

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-state.cpp
# Opt level: O0

void __thiscall mahjong::WiningState::WiningState(WiningState *this)

{
  WiningState *this_local;
  
  this->is_win_by_discard = false;
  this->round_wind = EastWind;
  this->seat_wind = EastWind;
  this->is_one_shot = false;
  this->is_last_discard = false;
  this->is_robbing_quad = false;
  this->is_last_tile_from_the_wall = false;
  this->is_dead_wall_draw = false;
  std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>::multiset
            (&this->bonus_tiles);
  this->is_uninterrupted_first_drawn = false;
  return;
}

Assistant:

WiningState::WiningState()
	: round_wind(Tile::EastWind)
	, seat_wind(Tile::EastWind)
{}